

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

bool __thiscall Matrix<double>::operator==(Matrix<double> *this,Matrix<double> *op2)

{
  int __x;
  double extraout_XMM0_Qa;
  int local_28;
  int local_24;
  int j;
  int i;
  Matrix<double> *op2_local;
  Matrix<double> *this_local;
  
  __x = (int)this;
  local_24 = 0;
  do {
    if (this->n <= local_24) {
      return true;
    }
    for (local_28 = 0; local_28 < this->m; local_28 = local_28 + 1) {
      std::abs(__x);
      if (1.1920928955078125e-07 < extraout_XMM0_Qa) {
        return false;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool operator==(const Matrix<T>& op2) const {
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        if (std::is_floating_point<T>::value) {
          if (abs(M[i][j] - op2.M[i][j]) > FLT_EPSILON)
                return false;
        } else {
          if (M[i][j] != op2.M[i][j]) {
            return false;
          }
        }
      }
    }
    return true;
  }